

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::UpdateWaterLevel(AActor *this,bool dosplash)

{
  double dVar1;
  uint uVar2;
  extsector_t *peVar3;
  F3DFloor **ppFVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  sector_t_conflict *psVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  DVector3 local_48;
  
  iVar6 = this->waterlevel;
  this->waterlevel = 0;
  psVar8 = (sector_t_conflict *)this->Sector;
  if (psVar8 == (sector_t_conflict *)0x0) {
    return false;
  }
  if ((psVar8->MoreFlags & 0x20) != 0) {
    this->waterlevel = 3;
    dVar11 = -3.4028234663852886e+38;
LAB_0042c2e5:
    bVar10 = false;
    goto LAB_0042c445;
  }
  psVar8 = sector_t::GetHeightSec(psVar8);
  if (psVar8 == (sector_t_conflict *)0x0) {
    peVar3 = this->Sector->e;
    ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar2 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar9 = 0; (ulong)uVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
      puVar5 = *(undefined8 **)((long)ppFVar4 + lVar9);
      if ((*(uint *)(puVar5 + 0xb) & 0x13) == 0x11) {
        dVar12 = secplane_t::ZatPoint((secplane_t *)*puVar5,this);
        dVar11 = secplane_t::ZatPoint((secplane_t *)puVar5[5],this);
        dVar1 = (this->__Pos).Z;
        if (dVar1 < dVar11) {
          dVar13 = this->Height;
          dVar14 = dVar13 * 0.5 + dVar1;
          if (dVar12 <= dVar14) {
            if (dVar11 <= dVar1) goto LAB_0042c3cc;
            this->waterlevel = 1;
            if (dVar11 <= dVar14) goto LAB_0042c2e5;
            this->waterlevel = 2;
            if (this->player == (player_t *)0x0) {
LAB_0042c4c4:
              if (dVar11 < dVar1 + dVar13) goto LAB_0042c2e5;
            }
            else if (dVar11 < dVar13 + dVar1) {
              dVar13 = this->player->viewheight;
              goto LAB_0042c4c4;
            }
            this->waterlevel = 3;
            goto LAB_0042c2e5;
          }
        }
      }
    }
    dVar11 = -3.4028234663852886e+38;
LAB_0042c3cc:
    bVar10 = false;
    goto LAB_0042c445;
  }
  dVar11 = secplane_t::ZatPoint(&psVar8->floorplane,this);
  dVar1 = (this->__Pos).Z;
  if (dVar11 <= dVar1) {
    if (((psVar8->MoreFlags & 2) != 0) ||
       (dVar12 = this->Height, dVar13 = secplane_t::ZatPoint(&psVar8->ceilingplane,this),
       dVar1 + dVar12 <= dVar13)) {
      iVar7 = 0;
    }
    else {
LAB_0042c430:
      iVar7 = 3;
    }
LAB_0042c433:
    this->waterlevel = iVar7;
  }
  else {
    this->waterlevel = 1;
    dVar12 = this->Height;
    if (dVar12 * 0.5 + dVar1 < dVar11) {
      this->waterlevel = 2;
      if (this->player == (player_t *)0x0) {
        if (dVar1 + dVar12 <= dVar11) goto LAB_0042c430;
      }
      else {
        iVar7 = 3;
        if ((dVar12 + dVar1 <= dVar11) || (dVar1 + this->player->viewheight <= dVar11))
        goto LAB_0042c433;
      }
    }
  }
  bVar10 = (psVar8->MoreFlags & 0x60) == 0;
LAB_0042c445:
  iVar7 = this->waterlevel;
  if ((iVar7 != 0 && this->boomwaterlevel == '\0') && dosplash) {
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = dVar11;
    P_HitWater(this,this->Sector,&local_48,true,true,false);
    iVar7 = this->waterlevel;
  }
  this->boomwaterlevel = (BYTE)iVar7;
  if (bVar10) {
    this->waterlevel = (uint)(byte)iVar6;
  }
  return false;
}

Assistant:

bool AActor::UpdateWaterLevel (bool dosplash)
{
	BYTE lastwaterlevel = waterlevel;
	double fh = -FLT_MAX;
	bool reset=false;

	waterlevel = 0;

	if (Sector == NULL)
	{
		return false;
	}

	if (Sector->MoreFlags & SECF_UNDERWATER)	// intentionally not SECF_UNDERWATERMASK
	{
		waterlevel = 3;
	}
	else
	{
		const sector_t *hsec = Sector->GetHeightSec();
		if (hsec != NULL)
		{
			fh = hsec->floorplane.ZatPoint (this);
			//if (hsec->MoreFlags & SECF_UNDERWATERMASK)	// also check Boom-style non-swimmable sectors
			{
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}
				else if (!(hsec->MoreFlags & SECF_FAKEFLOORONLY) && (Top() > hsec->ceilingplane.ZatPoint (this)))
				{
					waterlevel = 3;
				}
				else
				{
					waterlevel = 0;
				}
			}
			// even non-swimmable deep water must be checked here to do the splashes correctly
			// But the water level must be reset when this function returns
			if (!(hsec->MoreFlags&SECF_UNDERWATERMASK))
			{
				reset = true;
			}
		}
		else
		{
			// Check 3D floors as well!
			for(auto rover : Sector->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if(!(rover->flags & FF_SWIMMABLE) || rover->flags & FF_SOLID) continue;

				double ff_bottom=rover->bottom.plane->ZatPoint(this);
				double ff_top=rover->top.plane->ZatPoint(this);

				if(ff_top <= Z() || ff_bottom > (Center())) continue;
				
				fh=ff_top;
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}

				break;
			}
		}
	}
		
	// some additional checks to make deep sectors like Boom's splash without setting
	// the water flags. 
	if (boomwaterlevel == 0 && waterlevel != 0 && dosplash) 
	{
		P_HitWater(this, Sector, PosAtZ(fh), true);
	}
	boomwaterlevel = waterlevel;
	if (reset)
	{
		waterlevel = lastwaterlevel;
	}
	return false;	// we did the splash ourselves
}